

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::Solver::split(Solver *this,LitVec *out)

{
  uint32 *puVar1;
  uint uVar2;
  ExtendedStats *pEVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  Literal local_1c;
  
  bVar4 = splittable(this);
  if (bVar4) {
    copyGuidingPath(this,out);
    uVar2 = (this->levels_).super_type.ebo_.size;
    uVar5 = (this->levels_).root + 1;
    if (uVar2 <= uVar5) {
      uVar5 = uVar2;
    }
    (this->levels_).root = uVar5;
    uVar2 = *(uint *)&(this->levels_).field_0x14;
    uVar6 = uVar2 & 0x3fffffff;
    if (uVar6 <= uVar5) {
      uVar6 = uVar5;
    }
    *(uint *)&(this->levels_).field_0x14 = uVar2 & 0xc0000000 | uVar6 & 0x3fffffff;
    local_1c.rep_ =
         *(uint *)((long)&((this->assign_).trail.ebo_.buf)->rep_ +
                  (ulong)(uint)(*(int *)((this->levels_).super_type.ebo_.buf + (uVar5 - 1)) << 2)) &
         0xfffffffe ^ 2;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(out,&local_1c);
    this->splitReq_ = false;
    pEVar3 = (this->stats).extra;
    if (pEVar3 != (ExtendedStats *)0x0) {
      puVar1 = &pEVar3->splits;
      *puVar1 = *puVar1 + 1;
    }
  }
  return bVar4;
}

Assistant:

bool Solver::split(LitVec& out) {
	if (!splittable()) { return false; }
	copyGuidingPath(out);
	pushRootLevel();
	out.push_back(~decision(rootLevel()));
	splitReq_ = false;
	stats.addSplit();
	return true;
}